

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image * rf_image_color_grayscale(rf_image image)

{
  rf_image image_00;
  int iVar1;
  int iVar2;
  rf_image *in_RDI;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  rf_pixel_format in_stack_00000018;
  char cStack000000000000001c;
  
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->format = 0;
  in_RDI->valid = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  if (cStack000000000000001c == '\x01') {
    iVar1 = rf_bits_per_pixel(in_stack_00000018);
    iVar1 = iVar1 * in_stack_00000014 * in_stack_00000010;
    iVar2 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    image_00._20_4_ = _cStack000000000000001c;
    image_00.format = in_stack_00000018;
    image_00.height = in_stack_00000014;
    image_00.width = in_stack_00000010;
    image_00.data = in_stack_00000008;
    rf_image_format_to_buffer
              (in_RDI,image_00,RF_UNCOMPRESSED_GRAYSCALE,in_stack_00000008,(long)(iVar2 >> 3));
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_image_color_grayscale(rf_image image)
{
    rf_image result = {0};

    if (image.valid)
    {
        result = rf_image_color_grayscale_to_buffer(image, image.data, rf_image_size(image));
    }

    return result;
}